

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbiw__zlib_flushf(uchar *data,uint *bitbuffer,int *bitcount)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uchar *local_20;
  
  local_20 = data;
  if (7 < *bitcount) {
    piVar3 = bitcount;
    do {
      if ((local_20 == (uchar *)0x0) || (*(int *)(local_20 + -8) <= *(int *)(local_20 + -4) + 1)) {
        stbiw__sbgrowf(&local_20,1,(int)piVar3);
      }
      uVar2 = *bitbuffer;
      piVar3 = (int *)(long)*(int *)(local_20 + -4);
      *(int *)(local_20 + -4) = *(int *)(local_20 + -4) + 1;
      local_20[(long)piVar3] = (uchar)uVar2;
      *bitbuffer = *bitbuffer >> 8;
      iVar1 = *bitcount;
      *bitcount = iVar1 + -8;
    } while (0xf < iVar1);
  }
  return local_20;
}

Assistant:

static unsigned char *stbiw__zlib_flushf(unsigned char *data,
                                         unsigned int *bitbuffer,
                                         int *bitcount) {
  while (*bitcount >= 8) {
    stbiw__sbpush(data, STBIW_UCHAR(*bitbuffer));
    *bitbuffer >>= 8;
    *bitcount -= 8;
  }
  return data;
}